

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  CodedOutputStream *this;
  uint32 value_00;
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  CodedOutputStream *local_20;
  CodedOutputStream *output_local;
  string *value_local;
  int field_number_local;
  
  local_20 = output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  uVar1 = std::__cxx11::string::size();
  local_59 = 0;
  if (0x7fffffff < uVar1) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x20e);
    local_59 = 1;
    other = LogMessage::operator<<(&local_58,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  this = local_20;
  value_00 = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(this,value_00);
  io::CodedOutputStream::WriteString(local_20,(string *)output_local);
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}